

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_quality.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  long in_RSI;
  int in_EDI;
  int q;
  size_t data_size;
  uint8_t *data;
  char *filename;
  int ok;
  int quiet;
  int c;
  size_t *data_size_00;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = 0;
  iVar3 = 1;
  for (iVar5 = 1; iVar3 != 0 && iVar5 < in_EDI; iVar5 = iVar5 + 1) {
    iVar1 = strcmp(*(char **)(in_RSI + (long)iVar5 * 8),"-quiet");
    if (iVar1 == 0) {
      iVar4 = 1;
    }
    else {
      iVar1 = strcmp(*(char **)(in_RSI + (long)iVar5 * 8),"-help");
      if ((iVar1 == 0) || (iVar1 = strcmp(*(char **)(in_RSI + (long)iVar5 * 8),"-h"), iVar1 == 0)) {
        printf("webp_quality [-h][-quiet] webp_files...\n");
        return 0;
      }
      data_size_00 = *(size_t **)(in_RSI + (long)iVar5 * 8);
      iVar3 = ImgIoUtilReadFile((char *)CONCAT44(iVar5,iVar4),
                                (uint8_t **)CONCAT44(iVar3,in_stack_ffffffffffffffe0),data_size_00);
      if (iVar3 == 0) break;
      uVar2 = VP8EstimateQuality((uint8_t *)argv,_quiet);
      if (iVar4 == 0) {
        printf("[%s] ",data_size_00);
      }
      if ((int)uVar2 < 0) {
        fprintf(_stderr,"Not a WebP file, or not a lossy WebP file.\n");
        iVar3 = 0;
      }
      else if (iVar4 == 0) {
        printf("Estimated quality factor: %d\n",(ulong)uVar2);
      }
      else {
        printf("%d\n",(ulong)uVar2);
      }
      free((void *)0x0);
    }
  }
  return (uint)(iVar3 == 0);
}

Assistant:

int main(int argc, const char* argv[]) {
  int c;
  int quiet = 0;
  int ok = 1;

  INIT_WARGV(argc, argv);

  for (c = 1; ok && c < argc; ++c) {
    if (!strcmp(argv[c], "-quiet")) {
      quiet = 1;
    } else if (!strcmp(argv[c], "-help") || !strcmp(argv[c], "-h")) {
      printf("webp_quality [-h][-quiet] webp_files...\n");
      FREE_WARGV_AND_RETURN(0);
    } else {
      const char* const filename = (const char*)GET_WARGV(argv, c);
      const uint8_t* data = NULL;
      size_t data_size = 0;
      int q;
      ok = ImgIoUtilReadFile(filename, &data, &data_size);
      if (!ok) break;
      q = VP8EstimateQuality(data, data_size);
      if (!quiet) WPRINTF("[%s] ", (const W_CHAR*)filename);
      if (q < 0) {
        fprintf(stderr, "Not a WebP file, or not a lossy WebP file.\n");
        ok = 0;
      } else {
        if (!quiet) {
          printf("Estimated quality factor: %d\n", q);
        } else {
          printf("%d\n", q);   // just print the number
        }
      }
      free((void*)data);
    }
  }
  FREE_WARGV_AND_RETURN(ok ? 0 : 1);
}